

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

int nni_http_conn_getopt(nni_http_conn *conn,char *name,void *buf,size_t *szp,nni_type t)

{
  int local_30;
  int rv;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *name_local;
  nni_http_conn *conn_local;
  
  nni_mtx_lock(&conn->mtx);
  if ((conn->closed & 1U) == 0) {
    local_30 = nni_stream_get(conn->sock,name,buf,szp,t);
  }
  else {
    local_30 = 7;
  }
  nni_mtx_unlock(&conn->mtx);
  return local_30;
}

Assistant:

int
nni_http_conn_getopt(
    nni_http_conn *conn, const char *name, void *buf, size_t *szp, nni_type t)
{
	int rv;
	nni_mtx_lock(&conn->mtx);
	if (conn->closed) {
		rv = NNG_ECLOSED;
	} else {
		rv = nni_stream_get(conn->sock, name, buf, szp, t);
	}
	nni_mtx_unlock(&conn->mtx);
	return (rv);
}